

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_stable_compact(REF_NODE ref_node,REF_INT **o2n_ptr,REF_INT **n2o_ptr)

{
  int iVar1;
  int iVar2;
  REF_GLOB *pRVar3;
  REF_INT *__s;
  REF_INT *pRVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  int iVar8;
  char *pcVar9;
  
  iVar1 = ref_node->max;
  uVar7 = (ulong)iVar1;
  if ((long)uVar7 < 0) {
    pcVar9 = "malloc *o2n_ptr of REF_INT negative";
    uVar6 = 0x34d;
  }
  else {
    __s = (REF_INT *)malloc(uVar7 * 4);
    *o2n_ptr = __s;
    if (__s == (REF_INT *)0x0) {
      pcVar9 = "malloc *o2n_ptr of REF_INT NULL";
      uVar6 = 0x34d;
LAB_0012e9c0:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
             "ref_node_stable_compact",pcVar9);
      return 2;
    }
    if (iVar1 != 0) {
      memset(__s,0xff,uVar7 * 4);
    }
    iVar2 = ref_node->n;
    if ((long)iVar2 < 0) {
      pcVar9 = "malloc *n2o_ptr of REF_INT negative";
      uVar6 = 0x34f;
    }
    else {
      pRVar4 = (REF_INT *)malloc((long)iVar2 * 4);
      *n2o_ptr = pRVar4;
      if (pRVar4 == (REF_INT *)0x0) {
        pcVar9 = "malloc *n2o_ptr of REF_INT NULL";
        uVar6 = 0x34f;
        goto LAB_0012e9c0;
      }
      if (iVar1 == 0) {
        if (iVar2 == 0) {
          return 0;
        }
      }
      else {
        pRVar3 = ref_node->global;
        uVar5 = 0;
        iVar8 = 0;
        do {
          if (-1 < pRVar3[uVar5]) {
            __s[uVar5] = iVar8;
            iVar8 = iVar8 + 1;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < uVar7);
        if (iVar8 == iVar2) {
          if (iVar1 == 0) {
            return 0;
          }
          pRVar3 = ref_node->global;
          uVar5 = 0;
          do {
            if (-1 < pRVar3[uVar5]) {
              pRVar4[__s[uVar5]] = (REF_INT)uVar5;
            }
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
          return 0;
        }
      }
      pcVar9 = "nnode miscount";
      uVar6 = 0x359;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
         "ref_node_stable_compact",pcVar9);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_node_stable_compact(REF_NODE ref_node, REF_INT **o2n_ptr,
                                           REF_INT **n2o_ptr) {
  REF_INT node;
  REF_INT nnode;
  REF_INT *o2n, *n2o;

  ref_malloc_init(*o2n_ptr, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  o2n = *o2n_ptr;
  ref_malloc(*n2o_ptr, ref_node_n(ref_node), REF_INT);
  n2o = *n2o_ptr;

  nnode = 0;

  each_ref_node_valid_node(ref_node, node) {
    o2n[node] = nnode;
    nnode++;
  }

  RES(nnode, ref_node_n(ref_node), "nnode miscount");

  each_ref_node_valid_node(ref_node, node) n2o[o2n[node]] = node;

  return REF_SUCCESS;
}